

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O0

OPJ_BOOL opj_t2_encode_packet
                   (OPJ_UINT32 tileno,opj_tcd_tile_t *tile,opj_tcp_t *tcp,opj_pi_iterator_t *pi,
                   OPJ_BYTE *dest,OPJ_UINT32 *p_data_written,OPJ_UINT32 length,
                   opj_codestream_info_t *cstr_info,J2K_T2_MODE p_t2_mode,opj_event_mgr_t *p_manager
                   )

{
  uint uVar1;
  uint uVar2;
  uint value;
  int iVar3;
  int iVar4;
  int iVar5;
  opj_tcd_resolution_t *poVar6;
  opj_packet_info_t *poVar7;
  OPJ_BOOL OVar8;
  uint uVar9;
  uint uVar10;
  OPJ_INT32 OVar11;
  OPJ_INT32 OVar12;
  long lVar13;
  long lVar14;
  opj_bio_t *bio_00;
  OPJ_UINT32 *pOVar15;
  ulong uVar16;
  int *piVar17;
  opj_packet_info_t *info_PK_1;
  opj_tcd_layer_t *layer_2;
  opj_tcd_precinct_t *prc_2;
  opj_packet_info_t *info_PK;
  uint local_c8;
  OPJ_UINT32 l_nb_passes;
  OPJ_UINT32 passno;
  OPJ_UINT32 len;
  OPJ_UINT32 nump;
  OPJ_UINT32 increment;
  opj_tcd_layer_t *layer_1;
  opj_tcd_layer_t *layer;
  opj_tcd_precinct_t *prc_1;
  opj_tcd_precinct_t *prc;
  OPJ_BOOL packet_empty;
  opj_bio_t *bio;
  opj_tcd_resolution_t *res;
  opj_tcd_tilecomp_t *tilec;
  opj_tcd_pass_t *pass;
  opj_tcd_cblk_enc_t *cblk;
  opj_tcd_band_t *band;
  OPJ_UINT32 l_nb_blocks;
  OPJ_UINT32 layno;
  OPJ_UINT32 precno;
  OPJ_UINT32 resno;
  OPJ_UINT32 compno;
  OPJ_UINT32 l_nb_bytes;
  OPJ_BYTE *c;
  OPJ_UINT32 cblkno;
  OPJ_UINT32 bandno;
  OPJ_UINT32 *p_data_written_local;
  OPJ_BYTE *dest_local;
  opj_pi_iterator_t *pi_local;
  opj_tcp_t *tcp_local;
  opj_tcd_tile_t *tile_local;
  OPJ_UINT32 tileno_local;
  
  uVar1 = pi->resno;
  uVar2 = pi->precno;
  value = pi->layno;
  poVar6 = tile->comps[pi->compno].resolutions;
  _compno = dest;
  if ((tcp->csty & 2) != 0) {
    if (length < 6) {
      if (p_t2_mode == FINAL_PASS) {
        opj_event_msg(p_manager,1,
                      "opj_t2_encode_packet(): only %u bytes remaining in output buffer. %u needed.\n"
                      ,(ulong)length,6);
      }
      return 0;
    }
    *dest = 0xff;
    dest[1] = 0x91;
    dest[2] = '\0';
    dest[3] = '\x04';
    dest[4] = (OPJ_BYTE)(tile->packno >> 8);
    dest[5] = (OPJ_BYTE)tile->packno;
    _compno = dest + 6;
    length = length - 6;
  }
  if (value == 0) {
    cblk = (opj_tcd_cblk_enc_t *)poVar6[uVar1].bands;
    for (c._4_4_ = 0; c._4_4_ < poVar6[uVar1].numbands; c._4_4_ = c._4_4_ + 1) {
      OVar8 = opj_tcd_is_band_empty((opj_tcd_band_t *)cblk);
      if (OVar8 == 0) {
        lVar13 = *(long *)&cblk->x0 + (ulong)uVar2 * 0x38;
        opj_tgt_reset(*(opj_tgt_tree_t **)(lVar13 + 0x28));
        opj_tgt_reset(*(opj_tgt_tree_t **)(lVar13 + 0x30));
        iVar3 = *(int *)(lVar13 + 0x10);
        iVar4 = *(int *)(lVar13 + 0x14);
        for (c._0_4_ = 0; (uint)c < (uint)(iVar3 * iVar4); c._0_4_ = (uint)c + 1) {
          lVar14 = *(long *)(lVar13 + 0x18) + (ulong)(uint)c * 0x40;
          *(undefined4 *)(lVar14 + 0x34) = 0;
          opj_tgt_setvalue(*(opj_tgt_tree_t **)(lVar13 + 0x30),(uint)c,
                           cblk->y1 - *(int *)(lVar14 + 0x28));
        }
      }
      cblk = (opj_tcd_cblk_enc_t *)&cblk->data_size;
    }
  }
  bio_00 = opj_bio_create();
  if (bio_00 == (opj_bio_t *)0x0) {
    tile_local._4_4_ = 0;
  }
  else {
    opj_bio_init_enc(bio_00,_compno,length);
    opj_bio_write(bio_00,1,1);
    cblk = (opj_tcd_cblk_enc_t *)poVar6[uVar1].bands;
    for (c._4_4_ = 0; c._4_4_ < poVar6[uVar1].numbands; c._4_4_ = c._4_4_ + 1) {
      OVar8 = opj_tcd_is_band_empty((opj_tcd_band_t *)cblk);
      if (OVar8 == 0) {
        lVar13 = *(long *)&cblk->x0 + (ulong)uVar2 * 0x38;
        uVar9 = *(int *)(lVar13 + 0x10) * *(int *)(lVar13 + 0x14);
        pass = *(opj_tcd_pass_t **)(lVar13 + 0x18);
        for (c._0_4_ = 0; (uint)c < uVar9; c._0_4_ = (uint)c + 1) {
          if ((*(int *)&pass[2].field_0x4 == 0) &&
             (*(int *)((long)pass->distortiondec + (ulong)value * 0x18) != 0)) {
            opj_tgt_setvalue(*(opj_tgt_tree_t **)(lVar13 + 0x28),(uint)c,value);
          }
          pass = (opj_tcd_pass_t *)&pass[2].len;
        }
        pass = *(opj_tcd_pass_t **)(lVar13 + 0x18);
        for (c._0_4_ = 0; (uint)c < uVar9; c._0_4_ = (uint)c + 1) {
          pOVar15 = (OPJ_UINT32 *)((long)pass->distortiondec + (ulong)value * 0x18);
          len = 0;
          passno = 0;
          l_nb_passes = 0;
          if (*(int *)&pass[2].field_0x4 == 0) {
            opj_tgt_encode(bio_00,*(opj_tgt_tree_t **)(lVar13 + 0x28),(uint)c,value + 1);
          }
          else {
            opj_bio_write(bio_00,(uint)(*pOVar15 != 0),1);
          }
          if (*pOVar15 != 0) {
            if (*(int *)&pass[2].field_0x4 == 0) {
              *(undefined4 *)&pass[1].field_0x14 = 3;
              opj_tgt_encode(bio_00,*(opj_tgt_tree_t **)(lVar13 + 0x30),(uint)c,999);
            }
            opj_t2_putnumpasses(bio_00,*pOVar15);
            uVar10 = *(int *)&pass[2].field_0x4 + *pOVar15;
            tilec = (opj_tcd_tilecomp_t *)
                    (*(long *)&pass->len + (ulong)*(uint *)&pass[2].field_0x4 * 0x18);
            for (local_c8 = *(uint *)&pass[2].field_0x4; local_c8 < uVar10; local_c8 = local_c8 + 1)
            {
              passno = passno + 1;
              l_nb_passes = tilec->compno + l_nb_passes;
              if (((tilec->numresolutions & 1) != 0) ||
                 (local_c8 == (*(int *)&pass[2].field_0x4 + *pOVar15) - 1)) {
                OVar11 = opj_int_floorlog2(l_nb_passes);
                iVar3 = *(int *)&pass[1].field_0x14;
                OVar12 = opj_int_floorlog2(passno);
                len = opj_int_max(len,(OVar11 + 1) - (iVar3 + OVar12));
                l_nb_passes = 0;
                passno = 0;
              }
              tilec = (opj_tcd_tilecomp_t *)&tilec->minimum_num_resolutions;
            }
            opj_t2_putcommacode(bio_00,len);
            *(OPJ_UINT32 *)&pass[1].field_0x14 = len + *(int *)&pass[1].field_0x14;
            tilec = (opj_tcd_tilecomp_t *)
                    (*(long *)&pass->len + (ulong)*(uint *)&pass[2].field_0x4 * 0x18);
            for (local_c8 = *(uint *)&pass[2].field_0x4; local_c8 < uVar10; local_c8 = local_c8 + 1)
            {
              passno = passno + 1;
              l_nb_passes = tilec->compno + l_nb_passes;
              if (((tilec->numresolutions & 1) != 0) ||
                 (local_c8 == (*(int *)&pass[2].field_0x4 + *pOVar15) - 1)) {
                iVar3 = *(int *)&pass[1].field_0x14;
                OVar11 = opj_int_floorlog2(passno);
                opj_bio_write(bio_00,l_nb_passes,iVar3 + OVar11);
                l_nb_passes = 0;
                passno = 0;
              }
              tilec = (opj_tcd_tilecomp_t *)&tilec->minimum_num_resolutions;
            }
          }
          pass = (opj_tcd_pass_t *)&pass[2].len;
        }
      }
      cblk = (opj_tcd_cblk_enc_t *)&cblk->data_size;
    }
    OVar8 = opj_bio_flush(bio_00);
    if (OVar8 == 0) {
      opj_bio_destroy(bio_00);
      tile_local._4_4_ = 0;
    }
    else {
      uVar16 = opj_bio_numbytes(bio_00);
      _compno = _compno + (uVar16 & 0xffffffff);
      length = length - (int)uVar16;
      opj_bio_destroy(bio_00);
      if ((tcp->csty & 4) != 0) {
        if (length < 2) {
          if (p_t2_mode == FINAL_PASS) {
            opj_event_msg(p_manager,1,
                          "opj_t2_encode_packet(): only %u bytes remaining in output buffer. %u needed.\n"
                          ,(ulong)length,2);
          }
          return 0;
        }
        *_compno = 0xff;
        _compno[1] = 0x92;
        _compno = _compno + 2;
        length = length - 2;
      }
      if ((cstr_info != (opj_codestream_info_t *)0x0) && (cstr_info->index_write != 0)) {
        cstr_info->tile[tileno].packet[cstr_info->packno].end_ph_pos =
             (long)((int)_compno - (int)dest);
      }
      cblk = (opj_tcd_cblk_enc_t *)poVar6[uVar1].bands;
      for (c._4_4_ = 0; c._4_4_ < poVar6[uVar1].numbands; c._4_4_ = c._4_4_ + 1) {
        OVar8 = opj_tcd_is_band_empty((opj_tcd_band_t *)cblk);
        if (OVar8 == 0) {
          lVar13 = *(long *)&cblk->x0 + (ulong)uVar2 * 0x38;
          iVar3 = *(int *)(lVar13 + 0x10);
          iVar4 = *(int *)(lVar13 + 0x14);
          pass = *(opj_tcd_pass_t **)(lVar13 + 0x18);
          for (c._0_4_ = 0; (uint)c < (uint)(iVar3 * iVar4); c._0_4_ = (uint)c + 1) {
            piVar17 = (int *)((long)pass->distortiondec + (ulong)value * 0x18);
            if (*piVar17 != 0) {
              if (length < (uint)piVar17[1]) {
                if (p_t2_mode == FINAL_PASS) {
                  opj_event_msg(p_manager,1,
                                "opj_t2_encode_packet(): only %u bytes remaining in output buffer. %u needed.\n"
                                ,(ulong)length,(ulong)(uint)piVar17[1]);
                }
                return 0;
              }
              memcpy(_compno,*(void **)(piVar17 + 4),(ulong)(uint)piVar17[1]);
              *(int *)&pass[2].field_0x4 = *piVar17 + *(int *)&pass[2].field_0x4;
              _compno = _compno + (uint)piVar17[1];
              length = length - piVar17[1];
              if ((cstr_info != (opj_codestream_info_t *)0x0) && (cstr_info->index_write != 0)) {
                poVar7 = cstr_info->tile[tileno].packet;
                iVar5 = cstr_info->packno;
                poVar7[iVar5].disto = *(double *)(piVar17 + 2) + poVar7[iVar5].disto;
                if (cstr_info->D_max < poVar7[iVar5].disto) {
                  cstr_info->D_max = poVar7[iVar5].disto;
                }
              }
            }
            pass = (opj_tcd_pass_t *)&pass[2].len;
          }
        }
        cblk = (opj_tcd_cblk_enc_t *)&cblk->data_size;
      }
      if (_compno < dest) {
        __assert_fail("c >= dest",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/t2.c"
                      ,0x3bb,
                      "OPJ_BOOL opj_t2_encode_packet(OPJ_UINT32, opj_tcd_tile_t *, opj_tcp_t *, opj_pi_iterator_t *, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, opj_codestream_info_t *, J2K_T2_MODE, opj_event_mgr_t *)"
                     );
      }
      *p_data_written = ((int)_compno - (int)dest) + *p_data_written;
      tile_local._4_4_ = 1;
    }
  }
  return tile_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_t2_encode_packet(OPJ_UINT32 tileno,
                                     opj_tcd_tile_t * tile,
                                     opj_tcp_t * tcp,
                                     opj_pi_iterator_t *pi,
                                     OPJ_BYTE *dest,
                                     OPJ_UINT32 * p_data_written,
                                     OPJ_UINT32 length,
                                     opj_codestream_info_t *cstr_info,
                                     J2K_T2_MODE p_t2_mode,
                                     opj_event_mgr_t *p_manager)
{
    OPJ_UINT32 bandno, cblkno;
    OPJ_BYTE* c = dest;
    OPJ_UINT32 l_nb_bytes;
    OPJ_UINT32 compno = pi->compno;     /* component value */
    OPJ_UINT32 resno  = pi->resno;      /* resolution level value */
    OPJ_UINT32 precno = pi->precno;     /* precinct value */
    OPJ_UINT32 layno  = pi->layno;      /* quality layer value */
    OPJ_UINT32 l_nb_blocks;
    opj_tcd_band_t *band = 00;
    opj_tcd_cblk_enc_t* cblk = 00;
    opj_tcd_pass_t *pass = 00;

    opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
    opj_tcd_resolution_t *res = &tilec->resolutions[resno];

    opj_bio_t *bio = 00;    /* BIO component */
#ifdef ENABLE_EMPTY_PACKET_OPTIMIZATION
    OPJ_BOOL packet_empty = OPJ_TRUE;
#else
    OPJ_BOOL packet_empty = OPJ_FALSE;
#endif

    /* <SOP 0xff91> */
    if (tcp->csty & J2K_CP_CSTY_SOP) {
        if (length < 6) {
            if (p_t2_mode == FINAL_PASS) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "opj_t2_encode_packet(): only %u bytes remaining in "
                              "output buffer. %u needed.\n",
                              length, 6);
            }
            return OPJ_FALSE;
        }
        c[0] = 255;
        c[1] = 145;
        c[2] = 0;
        c[3] = 4;
#if 0
        c[4] = (tile->packno % 65536) / 256;
        c[5] = (tile->packno % 65536) % 256;
#else
        c[4] = (tile->packno >> 8) & 0xff; /* packno is uint32_t */
        c[5] = tile->packno & 0xff;
#endif
        c += 6;
        length -= 6;
    }
    /* </SOP> */

    if (!layno) {
        band = res->bands;

        for (bandno = 0; bandno < res->numbands; ++bandno, ++band) {
            opj_tcd_precinct_t *prc;

            /* Skip empty bands */
            if (opj_tcd_is_band_empty(band)) {
                continue;
            }

            prc = &band->precincts[precno];
            opj_tgt_reset(prc->incltree);
            opj_tgt_reset(prc->imsbtree);

            l_nb_blocks = prc->cw * prc->ch;
            for (cblkno = 0; cblkno < l_nb_blocks; ++cblkno) {
                cblk = &prc->cblks.enc[cblkno];

                cblk->numpasses = 0;
                opj_tgt_setvalue(prc->imsbtree, cblkno, band->numbps - (OPJ_INT32)cblk->numbps);
            }
        }
    }

    bio = opj_bio_create();
    if (!bio) {
        /* FIXME event manager error callback */
        return OPJ_FALSE;
    }
    opj_bio_init_enc(bio, c, length);

#ifdef ENABLE_EMPTY_PACKET_OPTIMIZATION
    /* WARNING: this code branch is disabled, since it has been reported that */
    /* such packets cause decoding issues with cinema J2K hardware */
    /* decoders: https://groups.google.com/forum/#!topic/openjpeg/M7M_fLX_Bco */

    /* Check if the packet is empty */
    /* Note: we could also skip that step and always write a packet header */
    band = res->bands;
    for (bandno = 0; bandno < res->numbands; ++bandno, ++band) {
        opj_tcd_precinct_t *prc;
        /* Skip empty bands */
        if (opj_tcd_is_band_empty(band)) {
            continue;
        }

        prc = &band->precincts[precno];
        l_nb_blocks = prc->cw * prc->ch;
        cblk = prc->cblks.enc;
        for (cblkno = 0; cblkno < l_nb_blocks; cblkno++, ++cblk) {
            opj_tcd_layer_t *layer = &cblk->layers[layno];

            /* if cblk not included, go to the next cblk  */
            if (!layer->numpasses) {
                continue;
            }
            packet_empty = OPJ_FALSE;
            break;
        }
        if (!packet_empty) {
            break;
        }
    }
#endif
    opj_bio_write(bio, packet_empty ? 0 : 1, 1);           /* Empty header bit */

    /* Writing Packet header */
    band = res->bands;
    for (bandno = 0; !packet_empty &&
            bandno < res->numbands; ++bandno, ++band)      {
        opj_tcd_precinct_t *prc;

        /* Skip empty bands */
        if (opj_tcd_is_band_empty(band)) {
            continue;
        }

        prc = &band->precincts[precno];
        l_nb_blocks = prc->cw * prc->ch;
        cblk = prc->cblks.enc;

        for (cblkno = 0; cblkno < l_nb_blocks; ++cblkno) {
            opj_tcd_layer_t *layer = &cblk->layers[layno];

            if (!cblk->numpasses && layer->numpasses) {
                opj_tgt_setvalue(prc->incltree, cblkno, (OPJ_INT32)layno);
            }

            ++cblk;
        }

        cblk = prc->cblks.enc;
        for (cblkno = 0; cblkno < l_nb_blocks; cblkno++) {
            opj_tcd_layer_t *layer = &cblk->layers[layno];
            OPJ_UINT32 increment = 0;
            OPJ_UINT32 nump = 0;
            OPJ_UINT32 len = 0, passno;
            OPJ_UINT32 l_nb_passes;

            /* cblk inclusion bits */
            if (!cblk->numpasses) {
                opj_tgt_encode(bio, prc->incltree, cblkno, (OPJ_INT32)(layno + 1));
            } else {
                opj_bio_write(bio, layer->numpasses != 0, 1);
            }

            /* if cblk not included, go to the next cblk  */
            if (!layer->numpasses) {
                ++cblk;
                continue;
            }

            /* if first instance of cblk --> zero bit-planes information */
            if (!cblk->numpasses) {
                cblk->numlenbits = 3;
                opj_tgt_encode(bio, prc->imsbtree, cblkno, 999);
            }

            /* number of coding passes included */
            opj_t2_putnumpasses(bio, layer->numpasses);
            l_nb_passes = cblk->numpasses + layer->numpasses;
            pass = cblk->passes +  cblk->numpasses;

            /* computation of the increase of the length indicator and insertion in the header     */
            for (passno = cblk->numpasses; passno < l_nb_passes; ++passno) {
                ++nump;
                len += pass->len;

                if (pass->term || passno == (cblk->numpasses + layer->numpasses) - 1) {
                    increment = (OPJ_UINT32)opj_int_max((OPJ_INT32)increment,
                                                        opj_int_floorlog2((OPJ_INT32)len) + 1
                                                        - ((OPJ_INT32)cblk->numlenbits + opj_int_floorlog2((OPJ_INT32)nump)));
                    len = 0;
                    nump = 0;
                }

                ++pass;
            }
            opj_t2_putcommacode(bio, (OPJ_INT32)increment);

            /* computation of the new Length indicator */
            cblk->numlenbits += increment;

            pass = cblk->passes +  cblk->numpasses;
            /* insertion of the codeword segment length */
            for (passno = cblk->numpasses; passno < l_nb_passes; ++passno) {
                nump++;
                len += pass->len;

                if (pass->term || passno == (cblk->numpasses + layer->numpasses) - 1) {
                    opj_bio_write(bio, (OPJ_UINT32)len,
                                  cblk->numlenbits + (OPJ_UINT32)opj_int_floorlog2((OPJ_INT32)nump));
                    len = 0;
                    nump = 0;
                }
                ++pass;
            }

            ++cblk;
        }
    }

    if (!opj_bio_flush(bio)) {
        opj_bio_destroy(bio);
        return OPJ_FALSE;               /* modified to eliminate longjmp !! */
    }

    l_nb_bytes = (OPJ_UINT32)opj_bio_numbytes(bio);
    c += l_nb_bytes;
    length -= l_nb_bytes;

    opj_bio_destroy(bio);

    /* <EPH 0xff92> */
    if (tcp->csty & J2K_CP_CSTY_EPH) {
        if (length < 2) {
            if (p_t2_mode == FINAL_PASS) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "opj_t2_encode_packet(): only %u bytes remaining in "
                              "output buffer. %u needed.\n",
                              length, 2);
            }
            return OPJ_FALSE;
        }
        c[0] = 255;
        c[1] = 146;
        c += 2;
        length -= 2;
    }
    /* </EPH> */

    /* << INDEX */
    /* End of packet header position. Currently only represents the distance to start of packet
       Will be updated later by incrementing with packet start value*/
    if (cstr_info && cstr_info->index_write) {
        opj_packet_info_t *info_PK = &cstr_info->tile[tileno].packet[cstr_info->packno];
        info_PK->end_ph_pos = (OPJ_INT32)(c - dest);
    }
    /* INDEX >> */

    /* Writing the packet body */
    band = res->bands;
    for (bandno = 0; !packet_empty && bandno < res->numbands; bandno++, ++band) {
        opj_tcd_precinct_t *prc;

        /* Skip empty bands */
        if (opj_tcd_is_band_empty(band)) {
            continue;
        }

        prc = &band->precincts[precno];
        l_nb_blocks = prc->cw * prc->ch;
        cblk = prc->cblks.enc;

        for (cblkno = 0; cblkno < l_nb_blocks; ++cblkno) {
            opj_tcd_layer_t *layer = &cblk->layers[layno];

            if (!layer->numpasses) {
                ++cblk;
                continue;
            }

            if (layer->len > length) {
                if (p_t2_mode == FINAL_PASS) {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "opj_t2_encode_packet(): only %u bytes remaining in "
                                  "output buffer. %u needed.\n",
                                  length, layer->len);
                }
                return OPJ_FALSE;
            }

            memcpy(c, layer->data, layer->len);
            cblk->numpasses += layer->numpasses;
            c += layer->len;
            length -= layer->len;

            /* << INDEX */
            if (cstr_info && cstr_info->index_write) {
                opj_packet_info_t *info_PK = &cstr_info->tile[tileno].packet[cstr_info->packno];
                info_PK->disto += layer->disto;
                if (cstr_info->D_max < info_PK->disto) {
                    cstr_info->D_max = info_PK->disto;
                }
            }

            ++cblk;
            /* INDEX >> */
        }
    }

    assert(c >= dest);
    * p_data_written += (OPJ_UINT32)(c - dest);

    return OPJ_TRUE;
}